

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connector.cpp
# Opt level: O0

uint __thiscall cppcms::impl::tcp_connector::hash(tcp_connector *this,string *key)

{
  ulong uVar1;
  byte *pbVar2;
  ulong in_RSI;
  long in_RDI;
  uint highorder;
  uchar c;
  size_t i;
  uint h;
  undefined8 local_28;
  undefined4 local_1c;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x10) == 1) {
    local_4 = 0;
  }
  else {
    local_1c = 0;
    local_28 = 0;
    while( true ) {
      uVar1 = std::__cxx11::string::size();
      if (uVar1 <= local_28) break;
      pbVar2 = (byte *)std::__cxx11::string::operator[](in_RSI);
      local_1c = (uint)*pbVar2 ^ local_1c >> 0x1b ^ local_1c << 5;
      local_28 = local_28 + 1;
    }
    local_4 = local_1c % *(uint *)(in_RDI + 0x10);
  }
  return local_4;
}

Assistant:

unsigned tcp_connector::hash(std::string const &key)
{
	if(conns==1) return 0;
	unsigned h=0;
	// crc 
	for(size_t i=0;i<key.size();i++)  {
		unsigned char c=key[i];

		unsigned highorder = h & 0xf8000000u;
		h<<=5;
		h^=highorder >> 27;
		h^=c;
	}
	return h % conns;
}